

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::RandCaseStatementSyntax::RandCaseStatementSyntax
          (RandCaseStatementSyntax *this,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token randCase,
          SyntaxList<slang::syntax::RandCaseItemSyntax> *items,Token endCase)

{
  pointer ppRVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = randCase._0_8_;
  StatementSyntax::StatementSyntax(&this->super_StatementSyntax,RandCaseStatement,label,attributes);
  (this->randCase).kind = (short)uVar5;
  (this->randCase).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->randCase).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->randCase).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->randCase).info = randCase.info;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0057ad48;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>)._M_extent
          ._M_extent_value;
  (this->items).super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (items->super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->items).super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057edb0;
  (this->endCase).kind = endCase.kind;
  (this->endCase).field_0x2 = endCase._2_1_;
  (this->endCase).numFlags = (NumericTokenFlags)endCase.numFlags.raw;
  (this->endCase).rawLen = endCase.rawLen;
  (this->endCase).info = endCase.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppRVar1 = (this->items).super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar2 = (this->items).super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(RandCaseStatementSyntax **)(*(long *)((long)ppRVar1 + lVar6) + 8) = this;
  }
  return;
}

Assistant:

RandCaseStatementSyntax(NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token randCase, const SyntaxList<RandCaseItemSyntax>& items, Token endCase) :
        StatementSyntax(SyntaxKind::RandCaseStatement, label, attributes), randCase(randCase), items(items), endCase(endCase) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }